

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestPrettyPrintCoverage::TestPrettyPrintCoverage(TestPrettyPrintCoverage *this)

{
  TestRegistry *this_00;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"PrettyPrintCoverage","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Test","");
  this_00 = testinator::TestRegistry::Instance();
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016a498;
  (this->super_Test).m_success = true;
  (this->super_Test).m_skipped = false;
  (this->super_Test).m_name._M_dataplus._M_p = (pointer)&(this->super_Test).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Test).m_name,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  (this->super_Test).m_registry = this_00;
  testinator::TestRegistry::Register(this_00,&this->super_Test,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016a5b0;
  return;
}

Assistant:

DEF_TEST(PrettyPrintCoverage, Test)
{
  testinator::TestRegistry r;
  ostringstream oss;
  std::unique_ptr<testinator::Outputter> op =
    make_unique<testinator::DefaultOutputter>(oss);

  TestPrettyPrintCoverageInternal myTestA(r, "A");
  testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

  static string expected1 = "[1,2,3]";
  static string expected2 = "\"Hello\"";
  return oss.str().find(expected1) != string::npos
    && oss.str().find(expected2) != string::npos;
}